

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

void __thiscall ON_Viewport::GetViewScale(ON_Viewport *this,double *x,double *y,double *z)

{
  double (*padVar1) [4];
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  double sz;
  double sy;
  double sx;
  double *z_local;
  double *y_local;
  double *x_local;
  ON_Viewport *this_local;
  
  if (x != (double *)0x0) {
    *x = 1.0;
  }
  if (y != (double *)0x0) {
    *y = 1.0;
  }
  if (z != (double *)0x0) {
    *z = 1.0;
  }
  bVar6 = ON_Xform::IsIdentity(&this->m_clip_mods,0.0);
  if (((((!bVar6) && (padVar1 = (this->m_clip_mods).m_xform + 3, (*padVar1)[0] == 0.0)) &&
       (!NAN((*padVar1)[0]))) &&
      ((pdVar2 = (this->m_clip_mods).m_xform[3] + 1, *pdVar2 == 0.0 && (!NAN(*pdVar2))))) &&
     (((pdVar2 = (this->m_clip_mods).m_xform[3] + 2, *pdVar2 == 0.0 &&
       ((!NAN(*pdVar2) && (pdVar2 = (this->m_clip_mods).m_xform[3] + 3, *pdVar2 == 1.0)))) &&
      (!NAN(*pdVar2))))) {
    dVar3 = (this->m_clip_mods).m_xform[0][0];
    dVar4 = (this->m_clip_mods).m_xform[1][1];
    dVar5 = (this->m_clip_mods).m_xform[2][2];
    if (((((2.3283064365386963e-10 < ABS(dVar3)) && (2.3283064365386963e-10 < ABS(dVar4))) &&
         (2.3283064365386963e-10 < ABS(dVar5))) &&
        (((pdVar2 = (this->m_clip_mods).m_xform[0] + 1, *pdVar2 == 0.0 && (!NAN(*pdVar2))) &&
         ((pdVar2 = (this->m_clip_mods).m_xform[0] + 2, *pdVar2 == 0.0 &&
          ((!NAN(*pdVar2) && (padVar1 = (this->m_clip_mods).m_xform + 1, (*padVar1)[0] == 0.0)))))))
        ) && ((!NAN((*padVar1)[0]) &&
              ((pdVar2 = (this->m_clip_mods).m_xform[1] + 2, *pdVar2 == 0.0 && (!NAN(*pdVar2)))))))
    {
      if (x != (double *)0x0) {
        *x = dVar3;
      }
      if (y != (double *)0x0) {
        *y = dVar4;
      }
      if (z != (double *)0x0) {
        *z = dVar5;
      }
    }
  }
  return;
}

Assistant:

void ON_Viewport::GetViewScale( double* x, double* y, double* z) const
{
  if (x) *x = 1.0;
  if (y) *y = 1.0;
  if (z) *z = 1.0;
  if ( !m_clip_mods.IsIdentity()
       && 0.0 == m_clip_mods.m_xform[3][0]
       && 0.0 == m_clip_mods.m_xform[3][1]
       && 0.0 == m_clip_mods.m_xform[3][2]
       && 1.0 == m_clip_mods.m_xform[3][3]
     )
  {
    // 04 May 2020 S. Baer (RH-37076)
    // Allow for negative scale values. See comments in SetViewScale
    double sx = m_clip_mods.m_xform[0][0];
    double sy = m_clip_mods.m_xform[1][1];
    double sz = m_clip_mods.m_xform[2][2];
    if (    fabs(sx) > ON_ZERO_TOLERANCE
         && fabs(sy) > ON_ZERO_TOLERANCE
         && fabs(sz) > ON_ZERO_TOLERANCE
         && 0.0 == m_clip_mods.m_xform[0][1]
         && 0.0 == m_clip_mods.m_xform[0][2]
         && 0.0 == m_clip_mods.m_xform[1][0]
         && 0.0 == m_clip_mods.m_xform[1][2]
      )
    {
      if (x) *x = sx;
      if (y) *y = sy;
      if (z) *z = sz;
    }
  }
}